

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

void __thiscall mkvmuxer::Chapters::~Chapters(Chapters *this)

{
  int iVar1;
  
  iVar1 = this->chapters_count_;
  while (0 < iVar1) {
    this->chapters_count_ = iVar1 - 1U;
    Chapter::Clear(this->chapters_ + (iVar1 - 1U));
    iVar1 = this->chapters_count_;
  }
  if (this->chapters_ != (Chapter *)0x0) {
    operator_delete__(&this->chapters_[-1].displays_size_);
  }
  this->chapters_ = (Chapter *)0x0;
  return;
}

Assistant:

Chapters::~Chapters() {
  while (chapters_count_ > 0) {
    Chapter& chapter = chapters_[--chapters_count_];
    chapter.Clear();
  }

  delete[] chapters_;
  chapters_ = NULL;
}